

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  uint uVar5;
  _func_void_int_int *p_Var6;
  ImGuiWindow *pIVar7;
  ImVec2 IVar8;
  bool bVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  ImGuiWindow **__dest;
  ImGuiWindow *pIVar12;
  ulong uVar13;
  ImGuiWindow **ppIVar14;
  ImGuiWindow **ppIVar15;
  int iVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  
  pIVar10 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xfb4,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  p_Var6 = (GImGui->IO).ImeSetInputScreenPosFn;
  if (p_Var6 != (_func_void_int_int *)0x0) {
    fVar1 = (GImGui->PlatformImePos).x;
    fVar2 = (GImGui->PlatformImePos).y;
    fVar18 = (GImGui->PlatformImeLastPos).x - fVar1;
    fVar19 = (GImGui->PlatformImeLastPos).y - fVar2;
    if (0.0001 < fVar18 * fVar18 + fVar19 * fVar19) {
      (*p_Var6)((int)fVar1,(int)fVar2);
      pIVar10->PlatformImeLastPos = pIVar10->PlatformImePos;
    }
  }
  if ((pIVar10->CurrentWindowStack).Size != 1) {
    __assert_fail("g.CurrentWindowStack.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xfc0,"void ImGui::EndFrame()");
  }
  pIVar12 = pIVar10->CurrentWindow;
  if ((pIVar12 != (ImGuiWindow *)0x0) && (pIVar12->WriteAccessed == false)) {
    pIVar12->Active = false;
  }
  End();
  if (((pIVar10->ActiveId == 0) && (pIVar10->HoveredId == 0)) &&
     ((pIVar12 = pIVar10->NavWindow, pIVar12 == (ImGuiWindow *)0x0 || (pIVar12->Appearing == false))
     )) {
    if ((pIVar10->IO).MouseClicked[0] == true) {
      if (pIVar10->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if (((pIVar12 != (ImGuiWindow *)0x0) &&
            (pIVar12 = GetFrontMostPopupModal(), pIVar11 = GImGui, pIVar12 == (ImGuiWindow *)0x0))
           && (GImGui->NavWindow != (ImGuiWindow *)0x0)) {
          GImGui->NavWindow = (ImGuiWindow *)0x0;
          pIVar11->NavInitRequest = false;
          pIVar11->NavId = 0;
          pIVar11->NavIdIsAlive = false;
          pIVar11->NavLayer = 0;
        }
      }
      else {
        FocusWindow(pIVar10->HoveredWindow);
        SetActiveID(pIVar10->HoveredWindow->MoveId,pIVar10->HoveredWindow);
        pIVar10->NavDisableHighlight = true;
        IVar3 = (pIVar10->IO).MousePos;
        IVar4 = pIVar10->HoveredRootWindow->Pos;
        IVar8.y = IVar3.y - IVar4.y;
        IVar8.x = IVar3.x - IVar4.x;
        pIVar10->ActiveIdClickOffset = IVar8;
        if (((pIVar10->HoveredWindow->Flags & 4) == 0) &&
           ((pIVar10->HoveredRootWindow->Flags & 4) == 0)) {
          pIVar10->MovingWindow = pIVar10->HoveredWindow;
        }
      }
    }
    if ((pIVar10->IO).MouseClicked[1] == true) {
      pIVar12 = GetFrontMostPopupModal();
      uVar13 = (ulong)(pIVar10->Windows).Size;
      if ((long)uVar13 < 1 || pIVar12 == (ImGuiWindow *)0x0) {
        if (pIVar12 == (ImGuiWindow *)0x0) {
LAB_001516df:
          pIVar12 = pIVar10->HoveredWindow;
        }
      }
      else {
        bVar9 = false;
        while (pIVar7 = (pIVar10->Windows).Data[uVar13 - 1], pIVar7 != pIVar12) {
          if (pIVar7 == pIVar10->HoveredWindow) {
            bVar9 = true;
          }
          if ((uVar13 < 2) || (uVar13 = uVar13 - 1, bVar9)) break;
        }
        if (bVar9) goto LAB_001516df;
      }
      ClosePopupsOverWindow(pIVar12);
    }
  }
  iVar16 = (pIVar10->WindowsSortBuffer).Capacity;
  if (iVar16 < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    iVar16 = 0;
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar15 = (pIVar10->WindowsSortBuffer).Data;
    ppIVar14 = (ImGuiWindow **)0x0;
    if (ppIVar15 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar15,(long)(pIVar10->WindowsSortBuffer).Size << 3);
      ppIVar14 = (pIVar10->WindowsSortBuffer).Data;
      if (ppIVar14 == (ImGuiWindow **)0x0) {
        ppIVar14 = (ImGuiWindow **)0x0;
      }
      else {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
    }
    (*GImAllocatorFreeFunc)(ppIVar14,GImAllocatorUserData);
    (pIVar10->WindowsSortBuffer).Data = __dest;
    (pIVar10->WindowsSortBuffer).Capacity = 0;
  }
  (pIVar10->WindowsSortBuffer).Size = 0;
  uVar5 = (pIVar10->Windows).Size;
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 <= iVar16) goto LAB_00151527;
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  ppIVar14 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar13 * 8,GImAllocatorUserData);
  ppIVar15 = (pIVar10->WindowsSortBuffer).Data;
  if (ppIVar15 == (ImGuiWindow **)0x0) {
LAB_00151503:
    ppIVar15 = (ImGuiWindow **)0x0;
  }
  else {
    memcpy(ppIVar14,ppIVar15,(long)(pIVar10->WindowsSortBuffer).Size << 3);
    ppIVar15 = (pIVar10->WindowsSortBuffer).Data;
    if (ppIVar15 == (ImGuiWindow **)0x0) goto LAB_00151503;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
  }
  (*GImAllocatorFreeFunc)(ppIVar15,GImAllocatorUserData);
  (pIVar10->WindowsSortBuffer).Data = ppIVar14;
  (pIVar10->WindowsSortBuffer).Capacity = uVar5;
  uVar13 = (ulong)(uint)(pIVar10->Windows).Size;
LAB_00151527:
  if ((int)uVar13 == 0) {
    iVar16 = 0;
  }
  else {
    uVar17 = 0;
    do {
      if ((long)(int)uVar13 <= (long)uVar17) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar12 = (pIVar10->Windows).Data[uVar17];
      if ((pIVar12->Active != true) || ((pIVar12->Flags & 0x1000000) == 0)) {
        AddWindowToSortedBuffer(&pIVar10->WindowsSortBuffer,pIVar12);
        uVar13 = (ulong)(uint)(pIVar10->Windows).Size;
      }
      uVar17 = uVar17 + 1;
      iVar16 = (int)uVar13;
    } while (uVar17 != uVar13);
  }
  if (iVar16 == (pIVar10->WindowsSortBuffer).Size) {
    (pIVar10->Windows).Size = iVar16;
    iVar16 = (pIVar10->WindowsSortBuffer).Capacity;
    (pIVar10->WindowsSortBuffer).Capacity = (pIVar10->Windows).Capacity;
    (pIVar10->Windows).Capacity = iVar16;
    ppIVar15 = (pIVar10->WindowsSortBuffer).Data;
    (pIVar10->WindowsSortBuffer).Data = (pIVar10->Windows).Data;
    (pIVar10->Windows).Data = ppIVar15;
    (pIVar10->IO).MouseWheel = 0.0;
    (pIVar10->IO).MouseWheelH = 0.0;
    (pIVar10->IO).InputCharacters[0] = 0;
    (pIVar10->IO).InputCharacters[1] = 0;
    (pIVar10->IO).InputCharacters[2] = 0;
    (pIVar10->IO).InputCharacters[3] = 0;
    (pIVar10->IO).InputCharacters[4] = 0;
    (pIVar10->IO).InputCharacters[5] = 0;
    (pIVar10->IO).InputCharacters[6] = 0;
    (pIVar10->IO).InputCharacters[7] = 0;
    (pIVar10->IO).InputCharacters[8] = 0;
    (pIVar10->IO).InputCharacters[9] = 0;
    (pIVar10->IO).InputCharacters[10] = 0;
    (pIVar10->IO).InputCharacters[0xb] = 0;
    (pIVar10->IO).InputCharacters[0xc] = 0;
    (pIVar10->IO).InputCharacters[0xd] = 0;
    (pIVar10->IO).InputCharacters[0xe] = 0;
    (pIVar10->IO).InputCharacters[0xf] = 0;
    *(undefined8 *)((pIVar10->IO).InputCharacters + 0x10) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 6) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0xe) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0x16) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0x1e) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0x26) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0x2e) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0x36) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0x3e) = 0;
    *(undefined8 *)((long)(pIVar10->IO).NavInputs + 0x46) = 0;
    (pIVar10->IO).NavInputs[0x13] = 0.0;
    (pIVar10->IO).NavInputs[0x14] = 0.0;
    pIVar10->FrameCountEnded = pIVar10->FrameCount;
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0x1000,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);                       // Forgot to call ImGui::NewFrame()
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit "Debug" window if it hasn't been used
    IM_ASSERT(g.CurrentWindowStack.Size == 1);    // Mismatched Begin()/End() calls
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    if (g.ActiveId == 0 && g.HoveredId == 0)
    {
        if (!g.NavWindow || !g.NavWindow->Appearing) // Unless we just made a window/popup appear
        {
            // Click to focus window and start moving (after we're done with all our widgets)
            if (g.IO.MouseClicked[0])
            {
                if (g.HoveredRootWindow != NULL)
                {
                    // Set ActiveId even if the _NoMove flag is set, without it dragging away from a window with _NoMove would activate hover on other windows.
                    FocusWindow(g.HoveredWindow);
                    SetActiveID(g.HoveredWindow->MoveId, g.HoveredWindow);
                    g.NavDisableHighlight = true;
                    g.ActiveIdClickOffset = g.IO.MousePos - g.HoveredRootWindow->Pos;
                    if (!(g.HoveredWindow->Flags & ImGuiWindowFlags_NoMove) && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoMove))
                        g.MovingWindow = g.HoveredWindow;
                }
                else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
                {
                    // Clicking on void disable focus
                    FocusWindow(NULL);
                }
            }

            // With right mouse button we close popups without changing focus
            // (The left mouse button path calls FocusWindow which will lead NewFrame->ClosePopupsOverWindow to trigger)
            if (g.IO.MouseClicked[1])
            {
                // Find the top-most window between HoveredWindow and the front most Modal Window.
                // This is where we can trim the popup stack.
                ImGuiWindow* modal = GetFrontMostPopupModal();
                bool hovered_window_above_modal = false;
                if (modal == NULL)
                    hovered_window_above_modal = true;
                for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
                {
                    ImGuiWindow* window = g.Windows[i];
                    if (window == modal)
                        break;
                    if (window == g.HoveredWindow)
                        hovered_window_above_modal = true;
                }
                ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal);
            }
        }
    }

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortedBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    memset(g.IO.InputCharacters, 0, sizeof(g.IO.InputCharacters));
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    g.FrameCountEnded = g.FrameCount;
}